

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::IntegerLiteral::serializeTo(IntegerLiteral *this,ASTSerializer *serializer)

{
  ASTSerializer *in_RSI;
  char *in_RDI;
  IntegerLiteral *in_stack_ffffffffffffff78;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  SVInt *this_00;
  SVInt local_58;
  undefined1 local_48 [40];
  int local_20;
  void *local_18;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff90,in_RDI);
  this_00 = &local_58;
  getValue(in_stack_ffffffffffffff78);
  slang::ConstantValue::ConstantValue((ConstantValue *)in_RSI,(SVInt *)in_stack_ffffffffffffff78);
  ASTSerializer::write(in_RSI,local_20,local_18,(size_t)local_48);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x13b33f6);
  SVInt::~SVInt(this_00);
  return;
}

Assistant:

void IntegerLiteral::serializeTo(ASTSerializer& serializer) const {
    serializer.write("value", getValue());
}